

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O0

void __thiscall
SplitStringTest_empty_long_Test<char32_t>::TestBody(SplitStringTest_empty_long_Test<char32_t> *this)

{
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  AssertHelper local_a0 [8];
  Message local_98 [15];
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_;
  vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  split_result;
  undefined1 local_50 [8];
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> delim;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> empty;
  SplitStringTest_empty_long_Test<char32_t> *this_local;
  
  std::__cxx11::u32string::u32string((u32string *)((long)&delim.field_2 + 8));
  make_delim_long<char32_t,std::__cxx11::u32string>
            ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             local_50,8,L'\0');
  jessilib::
  split<std::vector,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_nullptr>
            ((container_type *)&gtest_ar_.message_,
             (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             ((long)&delim.field_2 + 8),
             (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
             local_50);
  local_89 = std::
             vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
             ::empty((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
                      *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_c0,local_88,"split_result.empty()","false");
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&local_c0);
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/split.cpp"
               ,0xcd,pcVar2);
    testing::internal::AssertHelper::operator=(local_a0,local_98);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    testing::Message::~Message(local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  std::
  vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
             *)&gtest_ar_.message_);
  std::__cxx11::u32string::~u32string((u32string *)local_50);
  std::__cxx11::u32string::~u32string((u32string *)((long)&delim.field_2 + 8));
  return;
}

Assistant:

TYPED_TEST(SplitStringTest, empty_long) {
	std::basic_string<TypeParam> empty;
	auto delim = make_delim_long<TypeParam>(8);
	std::vector<decltype(empty)> split_result = split(empty, delim);
	EXPECT_TRUE(split_result.empty());
}